

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_rec rf_image_alpha_border(rf_image image,float threshold)

{
  long lVar1;
  rf_source_location source_location;
  rf_color rVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined8 in_R9;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long in_FS_OFFSET;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  rf_rec rVar14;
  uint local_84;
  uint local_80;
  
  if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
    if ((long)image.height < 1) {
      uVar9 = 0x10000;
      iVar3 = 1;
      iVar4 = 1;
      uVar10 = 0x10000;
    }
    else {
      lVar1 = *(long *)(&DAT_0017a710 + (long)(int)image.format * 8);
      lVar6 = 0;
      uVar10 = 0x10000;
      local_84 = 0;
      uVar9 = 0x10000;
      local_80 = 0;
      uVar8 = 0;
      do {
        if (0 < image.width) {
          uVar7 = 0;
          lVar5 = lVar6;
          do {
            rVar2 = rf_format_one_pixel_to_rgba32
                              ((void *)((lVar5 >> 0x20) + (long)image.data),image.format);
            if (((int)(threshold * 255.0) & 0xffU) < (uint)rVar2 >> 0x18) {
              if ((long)uVar7 < (long)(int)uVar10) {
                uVar10 = (uint)uVar7;
              }
              if (local_84 < uVar7) {
                local_84 = (uint)uVar7;
              }
              if ((long)uVar8 < (long)(int)uVar9) {
                uVar9 = (uint)uVar8;
              }
              if (local_80 < uVar8) {
                local_80 = (uint)uVar8;
              }
            }
            uVar7 = uVar7 + 1;
            lVar5 = lVar5 + lVar1;
          } while ((long)image.width != uVar7);
        }
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + lVar1 * image.width;
      } while (uVar8 != (long)image.height);
      iVar4 = local_84 + 1;
      iVar3 = local_80 + 1;
    }
    fVar11 = (float)(int)uVar10;
    fVar12 = (float)(int)uVar9;
    uVar13 = CONCAT44((float)(int)(iVar3 - uVar9),(float)(int)(iVar4 - uVar10));
  }
  else {
    source_location.proc_name._0_4_ = 0x17ae67;
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.proc_name._4_4_ = 0;
    source_location.line_in_file = 0x3c36;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Function only works for uncompressed formats but was called with format %d.",1,
                (ulong)image.format,(long)(int)image.format,in_R9);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_alpha_border";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3c36;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
    fVar11 = 0.0;
    fVar12 = 0.0;
    uVar13 = 0;
  }
  rVar14.y = fVar12;
  rVar14.x = fVar11;
  rVar14.width = (float)(int)uVar13;
  rVar14.height = (float)(int)((ulong)uVar13 >> 0x20);
  return rVar14;
}

Assistant:

RF_API rf_rec rf_image_alpha_border(rf_image image, float threshold)
{
    rf_rec crop = {0};

    if (rf_is_uncompressed_format(image.format))
    {
        int x_min = 65536; // Define a big enough number
        int x_max = 0;
        int y_min = 65536;
        int y_max = 0;

        int src_bpp = rf_bytes_per_pixel(image.format);
        int src_size = rf_image_size(image);
        unsigned char* src = image.data;

        for (rf_int y = 0; y < image.height; y++)
        {
            for (rf_int x = 0; x < image.width; x++)
            {
                int src_pos = (y * image.width + x) * src_bpp;

                rf_color rgba32_pixel = rf_format_one_pixel_to_rgba32(&src[src_pos], image.format);

                if (rgba32_pixel.a > (unsigned char)(threshold * 255.0f))
                {
                    if (x < x_min) x_min = x;
                    if (x > x_max) x_max = x;
                    if (y < y_min) y_min = y;
                    if (y > y_max) y_max = y;
                }
            }
        }

        crop = (rf_rec) { x_min, y_min, (x_max + 1) - x_min, (y_max + 1) - y_min };
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Function only works for uncompressed formats but was called with format %d.", image.format);

    return crop;
}